

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O1

int rops_handle_POLLOUT_ws(lws *wsi)

{
  undefined1 *puVar1;
  short sVar2;
  _lws_websocket_related *p_Var3;
  int iVar4;
  undefined8 in_RAX;
  uint uVar5;
  lws_write_protocol wp;
  uint uVar6;
  
  sVar2 = (short)wsi->wsistate;
  if (sVar2 == 0x11b) {
    _lws_log(0x10,"sending close packet\n");
    lwsl_hexdump_level(0x10,wsi->ws->ping_payload_buf + 0x10,
                       (ulong)wsi->ws->close_in_ping_buffer_len);
    wsi->field_0x2df = wsi->field_0x2df & 0xfd;
    iVar4 = lws_write(wsi,wsi->ws->ping_payload_buf + 0x10,(ulong)wsi->ws->close_in_ping_buffer_len,
                      4);
    uVar6 = 1;
    if (-1 < iVar4) {
      if ((wsi->field_0x2df & 4) == 0) {
        lwsi_set_state(wsi,0x11c);
      }
      else {
        lwsi_set_state(wsi,0x11d);
        lws_set_timeout(wsi,PENDING_TIMEOUT_CLOSE_ACK,5);
        uVar6 = 0;
        _lws_log(0x10,"sent close, await ack\n");
      }
    }
  }
  else if (((wsi->role_ops == &role_ops_ws) && ((wsi->ws->field_0x95 & 0x80) != 0)) ||
          ((sVar2 == 0x11c && ((wsi->ws->field_0x95 & 0x40) != 0)))) {
    p_Var3 = wsi->ws;
    wp = 4;
    if ((*(ushort *)&p_Var3->field_0x95 & 0x40) == 0) {
      if (wsi->wsistate_pre_close != 0) {
        *(ushort *)&p_Var3->field_0x95 = *(ushort *)&p_Var3->field_0x95 & 0xff3f;
        return 0;
      }
      _lws_log(8,"issuing pong %d on wsi %p\n",(ulong)p_Var3->ping_payload_len,wsi);
      wp = LWS_WRITE_PONG;
    }
    iVar4 = lws_write(wsi,wsi->ws->ping_payload_buf + 0x10,(ulong)wsi->ws->ping_payload_len,wp);
    if (iVar4 < 0) {
      uVar6 = 1;
    }
    else {
      puVar1 = &wsi->ws->field_0x95;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xff7f;
      uVar6 = *(ushort *)&wsi->ws->field_0x95 >> 6 & 1;
    }
  }
  else {
    uVar6 = 2;
    uVar5 = (uint)*(undefined8 *)&wsi->field_0x2dc;
    if (((uVar5 >> 0xc & 1) == 0) && ((wsi->ws->field_0x96 & 0x20) != 0)) {
      _lws_log(8,"%s: issuing ping on wsi %p: %s %s h2: %d\n","rops_handle_POLLOUT_ws",wsi,
               wsi->role_ops->name,wsi->protocol->name,
               CONCAT44((int)((ulong)in_RAX >> 0x20),uVar5 >> 1) & 0xffffffff00000001);
      puVar1 = &wsi->ws->field_0x95;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
      uVar6 = lws_write(wsi,wsi->ws->ping_payload_buf + 0x10,0,LWS_WRITE_PING);
      uVar6 = uVar6 >> 0x1f;
    }
  }
  return uVar6;
}

Assistant:

int rops_handle_POLLOUT_ws(struct lws *wsi)
{
	int write_type = LWS_WRITE_PONG;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	struct lws_ext_pm_deflate_rx_ebufs pmdrx;
	int ret, m;
#endif
	int n;

#if !defined(LWS_WITHOUT_EXTENSIONS)
	lwsl_debug("%s: %s: wsi->ws->tx_draining_ext %d\n", __func__,
			wsi->protocol->name, wsi->ws->tx_draining_ext);
#endif

	/* Priority 3: pending control packets (pong or close)
	 *
	 * 3a: close notification packet requested from close api
	 */

	if (lwsi_state(wsi) == LRS_WAITING_TO_SEND_CLOSE) {
		lwsl_debug("sending close packet\n");
		lwsl_hexdump_debug(&wsi->ws->ping_payload_buf[LWS_PRE],
				   wsi->ws->close_in_ping_buffer_len);
		wsi->waiting_to_send_close_frame = 0;
		n = lws_write(wsi, &wsi->ws->ping_payload_buf[LWS_PRE],
			      wsi->ws->close_in_ping_buffer_len,
			      LWS_WRITE_CLOSE);
		if (n >= 0) {
			if (wsi->close_needs_ack) {
				lwsi_set_state(wsi, LRS_AWAITING_CLOSE_ACK);
				lws_set_timeout(wsi, PENDING_TIMEOUT_CLOSE_ACK,
						5);
				lwsl_debug("sent close, await ack\n");

				return LWS_HP_RET_BAIL_OK;
			}
			wsi->close_needs_ack = 0;
			lwsi_set_state(wsi, LRS_RETURNED_CLOSE);
		}

		return LWS_HP_RET_BAIL_DIE;
	}

	/* else, the send failed and we should just hang up */

	if ((lwsi_role_ws(wsi) && wsi->ws->ping_pending_flag) ||
	    (lwsi_state(wsi) == LRS_RETURNED_CLOSE &&
	     wsi->ws->payload_is_close)) {

		if (wsi->ws->payload_is_close)
			write_type = LWS_WRITE_CLOSE;
		else {
			if (wsi->wsistate_pre_close) {
				/* we started close flow, forget pong */
				wsi->ws->ping_pending_flag = 0;
				return LWS_HP_RET_BAIL_OK;
			}
			lwsl_info("issuing pong %d on wsi %p\n",
				  wsi->ws->ping_payload_len, wsi);
		}

		n = lws_write(wsi, &wsi->ws->ping_payload_buf[LWS_PRE],
			      wsi->ws->ping_payload_len, write_type);
		if (n < 0)
			return LWS_HP_RET_BAIL_DIE;

		/* well he is sent, mark him done */
		wsi->ws->ping_pending_flag = 0;
		if (wsi->ws->payload_is_close) {
			// assert(0);
			/* oh... a close frame was it... then we are done */
			return LWS_HP_RET_BAIL_DIE;
		}

		/* otherwise for PING, leave POLLOUT active either way */
		return LWS_HP_RET_BAIL_OK;
	}

	if (!wsi->socket_is_permanently_unusable &&
	    wsi->ws->send_check_ping) {

		lwsl_info("%s: issuing ping on wsi %p: %s %s h2: %d\n", __func__, wsi,
				wsi->role_ops->name, wsi->protocol->name,
				wsi->mux_substream);
		wsi->ws->send_check_ping = 0;
		n = lws_write(wsi, &wsi->ws->ping_payload_buf[LWS_PRE],
			      0, LWS_WRITE_PING);
		if (n < 0)
			return LWS_HP_RET_BAIL_DIE;

		return LWS_HP_RET_BAIL_OK;
	}

	/* Priority 4: if we are closing, not allowed to send more data frags
	 *	       which means user callback or tx ext flush banned now
	 */
	if (lwsi_state(wsi) == LRS_RETURNED_CLOSE)
		return LWS_HP_RET_USER_SERVICE;

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/* Priority 5: Tx path extension with more to send
	 *
	 *	       These are handled as new fragments each time around
	 *	       So while we must block new writeable callback to enforce
	 *	       payload ordering, but since they are always complete
	 *	       fragments control packets can interleave OK.
	 */
	if (wsi->ws->tx_draining_ext) {
		lwsl_ext("SERVICING TX EXT DRAINING\n");
		if (lws_write(wsi, NULL, 0, LWS_WRITE_CONTINUATION) < 0)
			return LWS_HP_RET_BAIL_DIE;
		/* leave POLLOUT active */
		return LWS_HP_RET_BAIL_OK;
	}

	/* Priority 6: extensions
	 */
	if (!wsi->ws->extension_data_pending && !wsi->ws->tx_draining_ext) {
		lwsl_ext("%s: !wsi->ws->extension_data_pending\n", __func__);
		return LWS_HP_RET_USER_SERVICE;
	}

	/*
	 * Check in on the active extensions, see if they had pending stuff to
	 * spill... they need to get the first look-in otherwise sequence will
	 * be disordered.
	 *
	 * coming here with a NULL, zero-length ebuf means just spill pending
	 */

	ret = 1;
	if (wsi->role_ops == &role_ops_raw_skt ||
	    wsi->role_ops == &role_ops_raw_file)
		ret = 0;

	while (ret == 1) {

		/* default to nobody has more to spill */

		ret = 0;
		pmdrx.eb_in.token = NULL;
		pmdrx.eb_in.len = 0;

		/* give every extension a chance to spill */

		m = lws_ext_cb_active(wsi, LWS_EXT_CB_PACKET_TX_PRESEND,
				      &pmdrx, 0);
		if (m < 0) {
			lwsl_err("ext reports fatal error\n");
			return LWS_HP_RET_BAIL_DIE;
		}
		if (m)
			/*
			 * at least one extension told us he has more
			 * to spill, so we will go around again after
			 */
			ret = 1;

		/* assuming they gave us something to send, send it */

		if (pmdrx.eb_in.len) {
			n = lws_issue_raw(wsi, (unsigned char *)pmdrx.eb_in.token,
					pmdrx.eb_in.len);
			if (n < 0) {
				lwsl_info("closing from POLLOUT spill\n");
				return LWS_HP_RET_BAIL_DIE;
			}
			/*
			 * Keep amount spilled small to minimize chance of this
			 */
			if (n != pmdrx.eb_in.len) {
				lwsl_err("Unable to spill ext %d vs %d\n",
						pmdrx.eb_in.len, n);
				return LWS_HP_RET_BAIL_DIE;
			}
		} else
			continue;

		/* no extension has more to spill */

		if (!ret)
			continue;

		/*
		 * There's more to spill from an extension, but we just sent
		 * something... did that leave the pipe choked?
		 */

		if (!lws_send_pipe_choked(wsi))
			/* no we could add more */
			continue;

		lwsl_info("choked in POLLOUT service\n");

		/*
		 * Yes, he's choked.  Leave the POLLOUT masked on so we will
		 * come back here when he is unchoked.  Don't call the user
		 * callback to enforce ordering of spilling, he'll get called
		 * when we come back here and there's nothing more to spill.
		 */

		return LWS_HP_RET_BAIL_OK;
	}

	wsi->ws->extension_data_pending = 0;
#endif

	return LWS_HP_RET_USER_SERVICE;
}